

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

cmCPackComponent * __thiscall
cmCPackIFWGenerator::GetComponent
          (cmCPackIFWGenerator *this,string *projectName,string *componentName)

{
  PackagesMap *this_00;
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *this_01;
  long *msg;
  int iVar2;
  iterator iVar3;
  cmCPackComponent *component;
  iterator iVar4;
  ostream *poVar5;
  size_t length;
  _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
  *this_02;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
  pVar6;
  cmCPackIFWPackage *package;
  string name;
  ostringstream cmCPackLog_msg;
  cmCPackIFWPackage *local_1e0;
  string local_1d8;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  cmCPackIFWPackage *local_178;
  ios_base local_128 [264];
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::find(&(this->super_cmCPackGenerator).Components._M_t,componentName);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header) {
    component = cmCPackGenerator::GetComponent
                          (&this->super_cmCPackGenerator,projectName,componentName);
    if (component == (cmCPackComponent *)0x0) {
      component = (cmCPackComponent *)0x0;
    }
    else {
      GetComponentPackageName_abi_cxx11_(&local_1d8,this,component);
      this_00 = &this->Packages;
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
              ::find(&this_00->_M_t,&local_1d8);
      if ((_Rb_tree_header *)iVar4._M_node == &(this->Packages)._M_t._M_impl.super__Rb_tree_header)
      {
        local_1e0 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                    ::operator[](this_00,&local_1d8);
        std::__cxx11::string::_M_assign((string *)&local_1e0->Name);
        (local_1e0->super_cmCPackIFWCommon).Generator = this;
        iVar2 = cmCPackIFWPackage::ConfigureFromComponent(local_1e0,component);
        if (iVar2 == 0) {
          pVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                  ::equal_range(&this_00->_M_t,&local_1d8);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
          ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,
                         (_Base_ptr)pVar6.second._M_node);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_198,"Cannot configure package \"",0x1a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_198,local_1d8._M_dataplus._M_p,
                              local_1d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" for component \"",0x11);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(component->Name)._M_dataplus._M_p,
                              (component->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
          std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          pcVar1 = (this->super_cmCPackIFWCommon).Generator;
          if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
            this_01 = (pcVar1->super_cmCPackGenerator).Logger;
            std::__cxx11::stringbuf::str();
            msg = local_1b8;
            length = strlen((char *)local_1b8);
            cmCPackLog::Log(this_01,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                            ,0x205,(char *)msg,length);
            if (local_1b8 != local_1a8) {
              operator_delete(local_1b8,local_1a8[0] + 1);
            }
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
          std::ios_base::~ios_base(local_128);
        }
        else {
          local_1e0->Installer = &this->Installer;
          local_198._0_8_ = &local_188;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_198,local_1d8._M_dataplus._M_p,
                     local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
          local_178 = local_1e0;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCPackIFWPackage*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                      *)&(this->Installer).Packages,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
                      *)local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._0_8_ != &local_188) {
            operator_delete((void *)local_198._0_8_,local_188._M_allocated_capacity + 1);
          }
          local_198._8_8_ = local_1e0;
          local_198._0_8_ = component;
          std::
          _Rb_tree<cmCPackComponent*,std::pair<cmCPackComponent*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>,std::less<cmCPackComponent*>,std::allocator<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>>
          ::_M_emplace_unique<std::pair<cmCPackComponent*,cmCPackIFWPackage*>>
                    ((_Rb_tree<cmCPackComponent*,std::pair<cmCPackComponent*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>,std::less<cmCPackComponent*>,std::allocator<std::pair<cmCPackComponent*const,cmCPackIFWPackage*>>>
                      *)&this->ComponentPackages,
                     (pair<cmCPackComponent_*,_cmCPackIFWPackage_*> *)local_198);
          this_02 = (_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                     *)&this->BinaryPackages;
          if ((component->field_0x48 & 8) != 0) {
            this_02 = (_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                       *)&this->DownloadedPackages;
          }
          std::
          _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
          ::_M_insert_unique<cmCPackIFWPackage*const&>(this_02,&local_1e0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    component = (cmCPackComponent *)(iVar3._M_node + 2);
  }
  return component;
}

Assistant:

cmCPackComponent* cmCPackIFWGenerator::GetComponent(
  const std::string& projectName, const std::string& componentName)
{
  auto cit = this->Components.find(componentName);
  if (cit != this->Components.end()) {
    return &(cit->second);
  }

  cmCPackComponent* component =
    this->cmCPackGenerator::GetComponent(projectName, componentName);
  if (!component) {
    return component;
  }

  std::string name = this->GetComponentPackageName(component);
  auto pit = this->Packages.find(name);
  if (pit != this->Packages.end()) {
    return component;
  }

  cmCPackIFWPackage* package = &this->Packages[name];
  package->Name = name;
  package->Generator = this;
  if (package->ConfigureFromComponent(component)) {
    package->Installer = &this->Installer;
    this->Installer.Packages.insert(
      std::pair<std::string, cmCPackIFWPackage*>(name, package));
    this->ComponentPackages.insert(
      std::pair<cmCPackComponent*, cmCPackIFWPackage*>(component, package));
    if (component->IsDownloaded) {
      this->DownloadedPackages.insert(package);
    } else {
      this->BinaryPackages.insert(package);
    }
  } else {
    this->Packages.erase(name);
    cmCPackIFWLogger(ERROR,
                     "Cannot configure package \""
                       << name << "\" for component \"" << component->Name
                       << "\"" << std::endl);
  }

  return component;
}